

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::swizzleI8x16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int32_t iVar1;
  reference pvVar2;
  Literal local_4d8;
  ulong local_4c0;
  size_t index;
  size_t i;
  LaneArray<16> result;
  undefined1 local_320 [8];
  LaneArray<16> indices;
  LaneArray<16> lanes;
  Literal *other_local;
  Literal *this_local;
  
  getLanesUI8x16((LaneArray<16> *)&indices._M_elems[0xf].type,this);
  getLanesUI8x16((LaneArray<16> *)local_320,other);
  std::array<wasm::Literal,_16UL>::array((array<wasm::Literal,_16UL> *)&i);
  for (index = 0; index < 0x10; index = index + 1) {
    pvVar2 = std::array<wasm::Literal,_16UL>::operator[]
                       ((array<wasm::Literal,_16UL> *)local_320,index);
    iVar1 = geti32(pvVar2);
    local_4c0 = (ulong)iVar1;
    if (local_4c0 < 0x10) {
      pvVar2 = std::array<wasm::Literal,_16UL>::operator[]
                         ((array<wasm::Literal,_16UL> *)&indices._M_elems[0xf].type,local_4c0);
      Literal(&local_4d8,pvVar2);
    }
    else {
      Literal(&local_4d8,0);
    }
    pvVar2 = std::array<wasm::Literal,_16UL>::operator[]((array<wasm::Literal,_16UL> *)&i,index);
    operator=(pvVar2,&local_4d8);
    ~Literal(&local_4d8);
  }
  Literal(__return_storage_ptr__,(LaneArray<16> *)&i);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)&i);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_320);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)&indices._M_elems[0xf].type)
  ;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::swizzleI8x16(const Literal& other) const {
  auto lanes = getLanesUI8x16();
  auto indices = other.getLanesUI8x16();
  LaneArray<16> result;
  for (size_t i = 0; i < 16; ++i) {
    size_t index = indices[i].geti32();
    result[i] = index >= 16 ? Literal(int32_t(0)) : lanes[index];
  }
  return Literal(result);
}